

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-curse.c
# Opt level: O2

_Bool append_object_curse(object *obj,wchar_t pick,wchar_t power)

{
  ushort uVar1;
  effect *peVar2;
  curse *pcVar3;
  _Bool _Var4;
  effect_index eVar5;
  int iVar6;
  wchar_t wVar7;
  curse_data *pcVar8;
  angband_constants *paVar9;
  timed_failure *ptVar10;
  ulong uVar11;
  
  pcVar3 = curses;
  if (obj->curses == (curse_data *)0x0) {
    pcVar8 = (curse_data *)mem_zalloc((ulong)z_info->curse_max << 3);
    obj->curses = pcVar8;
  }
  paVar9 = z_info;
  for (uVar11 = 0; uVar11 < paVar9->curse_max; uVar11 = uVar11 + 1) {
    if ((obj->curses[uVar11].power != L'\0') &&
       (_Var4 = curses_conflict((wchar_t)uVar11,pick), paVar9 = z_info, _Var4)) goto LAB_00176265;
  }
  peVar2 = (pcVar3[pick].obj)->effect;
  if ((peVar2 == (effect *)0x0) ||
     (uVar1 = peVar2->index, eVar5 = effect_lookup("TIMED_INC"), eVar5 != uVar1)) {
LAB_001761c2:
    iVar6 = flag_next(pcVar3[pick].conflict_flags,5,1);
    for (; iVar6 != 0; iVar6 = flag_next(pcVar3[pick].conflict_flags,5,iVar6 + 1)) {
      _Var4 = flag_has_dbg(obj->flags,5,iVar6,"obj->flags","i");
      if (_Var4) goto LAB_00176265;
    }
    if (obj->curses[pick].power < power) {
      obj->curses[pick].power = power;
      wVar7 = randcalc((pcVar3[pick].obj)->time,0,RANDOMISE);
      obj->curses[pick].timeout = wVar7;
      return true;
    }
  }
  else {
    uVar11 = (ulong)(uint)(pcVar3[pick].obj)->effect->subtype;
    if (0x34 < uVar11) {
      __assert_fail("idx >= 0 && idx < TMD_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/obj-curse.c"
                    ,0xa5,"_Bool append_object_curse(struct object *, int, int)");
    }
    ptVar10 = (timed_failure *)&timed_effects[uVar11].fail;
    do {
      while( true ) {
        ptVar10 = ptVar10->next;
        if (ptVar10 == (timed_failure *)0x0) goto LAB_001761c2;
        iVar6 = ptVar10->code;
        if (iVar6 == 3) break;
        if (iVar6 == 2) {
          if (0x18 < (ulong)(uint)ptVar10->idx) {
            __assert_fail("f->idx >= 0 && f->idx < ELEM_MAX",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/obj-curse.c"
                          ,0xae,"_Bool append_object_curse(struct object *, int, int)");
          }
          if (0 < obj->el_info[(uint)ptVar10->idx].res_level) goto LAB_00176265;
        }
        else if ((iVar6 == 1) &&
                (_Var4 = flag_has_dbg(obj->flags,5,ptVar10->idx,"obj->flags","f->idx"), _Var4))
        goto LAB_00176265;
      }
      if (0x18 < (ulong)(uint)ptVar10->idx) {
        __assert_fail("f->idx >= 0 && f->idx < ELEM_MAX",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/obj-curse.c"
                      ,0xb4,"_Bool append_object_curse(struct object *, int, int)");
      }
    } while (-1 < obj->el_info[(uint)ptVar10->idx].res_level);
  }
LAB_00176265:
  check_object_curses(obj);
  return false;
}

Assistant:

bool append_object_curse(struct object *obj, int pick, int power)
{
	struct curse *c = &curses[pick];
	int i;

	if (!obj->curses)
		obj->curses = mem_zalloc(z_info->curse_max * sizeof(struct curse_data));

	/* Reject conflicting curses */
	for (i = 0; i < z_info->curse_max; i++) {
		if (obj->curses[i].power && curses_conflict(i, pick)) {
			check_object_curses(obj);
			return false;
		}
	}

	/* Reject curses with effects foiled by an existing object property */
	if (c->obj->effect && c->obj->effect->index
			== effect_lookup("TIMED_INC")) {
		int idx = c->obj->effect->subtype;
		const struct timed_failure *f;

		assert(idx >= 0 && idx < TMD_MAX);
		f = timed_effects[idx].fail;
		while (f) {
			if (f->code == TMD_FAIL_FLAG_OBJECT) {
				if (of_has(obj->flags, f->idx)) {
					check_object_curses(obj);
					return false;
				}
			} else if (f->code == TMD_FAIL_FLAG_RESIST) {
				assert(f->idx >= 0 && f->idx < ELEM_MAX);
				if (obj->el_info[f->idx].res_level > 0) {
					check_object_curses(obj);
					return false;
				}
			} else if (f->code == TMD_FAIL_FLAG_VULN) {
				assert(f->idx >= 0 && f->idx < ELEM_MAX);
				if (obj->el_info[f->idx].res_level < 0) {
					check_object_curses(obj);
					return false;
				}
			}
			f = f->next;
		}
	}

	/* Reject curses which explicitly conflict with an object property */
	for (i = of_next(c->conflict_flags, FLAG_START); i != FLAG_END;
		 i = of_next(c->conflict_flags, i + 1)) {
		if (of_has(obj->flags, i)) {
			check_object_curses(obj);
			return false;
		}
	}

	/* Adjust power if our pick is a duplicate */
	if (power > obj->curses[pick].power) {
		obj->curses[pick].power = power;
		obj->curses[pick].timeout = randcalc(c->obj->time, 0, RANDOMISE);
		return true;
	}

	check_object_curses(obj);
	return false;
}